

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,libssh2_curve_type curve_type,string_buf *decrypted,
              uchar **method,size_t *method_len,uchar **pubkeydata,size_t *pubkeydata_len,
              EC_KEY **ec_ctx)

{
  int iVar1;
  uint uVar2;
  BIGNUM *ret;
  EVP_PKEY *pkey;
  char *pcVar3;
  uchar *point_buf;
  uchar *exponent;
  size_t pointlen;
  size_t exponentlen;
  size_t curvelen;
  uchar *curve;
  EC_KEY *local_68;
  uchar *local_60;
  uchar *local_58;
  size_t local_50;
  int local_48 [2];
  size_t local_40;
  uchar *local_38;
  
  local_68 = (EC_KEY *)0x0;
  iVar1 = _libssh2_get_string(decrypted,&local_38,&local_40);
  if ((iVar1 != 0) || (local_40 == 0)) {
    pcVar3 = "ECDSA no curve";
LAB_001229ec:
    _libssh2_error(session,-0xe,pcVar3);
    return -1;
  }
  iVar1 = _libssh2_get_string(decrypted,&local_60,&local_50);
  if (iVar1 != 0) {
    pcVar3 = "ECDSA no point";
    goto LAB_001229ec;
  }
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_58,(size_t *)local_48);
  if (iVar1 != 0) {
    pcVar3 = "ECDSA no exponent";
    goto LAB_001229ec;
  }
  iVar1 = _libssh2_ecdsa_curve_name_with_octal_new(&local_68,local_60,local_50,curve_type);
  if (iVar1 == 0) {
    ret = BN_new();
    if (ret != (BIGNUM *)0x0) {
      BN_bin2bn(local_58,local_48[0],ret);
      iVar1 = EC_KEY_set_private_key((EC_KEY *)local_68,ret);
      uVar2 = (uint)(iVar1 != 1);
      if ((((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) && (iVar1 == 1)) &&
         (local_68 != (EC_KEY *)0x0)) {
        pkey = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pkey,(ec_key_st *)local_68);
        uVar2 = gen_publickey_from_ec_evp
                          (session,method,method_len,pubkeydata,pubkeydata_len,0,(EVP_PKEY *)pkey);
        if (pkey != (EVP_PKEY *)0x0) {
          EVP_PKEY_free(pkey);
        }
      }
      if (ec_ctx != (EC_KEY **)0x0) {
        *ec_ctx = local_68;
        return uVar2;
      }
      goto LAB_00122a6b;
    }
    pcVar3 = "Unable to allocate memory for private key data";
    iVar1 = -6;
  }
  else {
    pcVar3 = "ECDSA could not create key";
    iVar1 = -0xe;
  }
  _libssh2_error(session,iVar1,pcVar3);
  uVar2 = 0xffffffff;
  if (local_68 == (EC_KEY *)0x0) {
    return -1;
  }
LAB_00122a6b:
  EC_KEY_free((EC_KEY *)local_68);
  return uVar2;
}

Assistant:

static int
gen_publickey_from_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                           libssh2_curve_type curve_type,
                                           struct string_buf *decrypted,
                                           unsigned char **method,
                                           size_t *method_len,
                                           unsigned char **pubkeydata,
                                           size_t *pubkeydata_len,
                                           libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, exponentlen, pointlen;
    unsigned char *curve, *exponent, *point_buf;
    EC_KEY *ec_key = NULL;
    BIGNUM *bn_exponent;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ECDSA keys from private key data"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &exponent, &exponentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no exponent");
        return -1;
    }

    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  curve_type);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    bn_exponent = BN_new();
    if(!bn_exponent) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    BN_bin2bn(exponent, (int) exponentlen, bn_exponent);
    rc = (EC_KEY_set_private_key(ec_key, bn_exponent) != 1);

    if(rc == 0 && ec_key && pubkeydata && method) {
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       0, pk);

        if(pk)
            EVP_PKEY_free(pk);
    }

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        EC_KEY_free(ec_key);

    return rc;

fail:
    if(ec_key)
        EC_KEY_free(ec_key);

    return rc;
}